

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall Lowerer::GenerateFastRealStackArgumentsLdLen(Lowerer *this,Instr *ldLen)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  IntConstOpnd *this_00;
  Instr *pIVar4;
  undefined4 *puVar5;
  Opnd *dst;
  
  bVar2 = Func::IsInlinee(ldLen->m_func);
  if (bVar2) {
    dst = ldLen->m_dst;
    this_00 = IR::IntConstOpnd::New
                        ((ulong)ldLen->m_func->actualCount - 1,TyUint32,ldLen->m_func,false);
  }
  else {
    pIVar4 = LowererMD::LoadInputParamCount(&this->m_lowererMD,ldLen,-1,false);
    this_00 = (IntConstOpnd *)pIVar4->m_dst;
    OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    dst = ldLen->m_dst;
  }
  InsertMove(dst,&this_00->super_Opnd,ldLen,true);
  IR::Instr::Remove(ldLen);
  return false;
}

Assistant:

bool
Lowerer::GenerateFastRealStackArgumentsLdLen(IR::Instr *ldLen)
{
    if(ldLen->m_func->IsInlinee())
    {
        //Get the length of the arguments
        Lowerer::InsertMove(ldLen->GetDst(),
                               IR::IntConstOpnd::New(ldLen->m_func->actualCount - 1, TyUint32, ldLen->m_func),
                               ldLen);
    }
    else
    {
        IR::Instr *loadInputParamCountInstr = this->m_lowererMD.LoadInputParamCount(ldLen, -1);
        IR::RegOpnd *actualCountOpnd = loadInputParamCountInstr->GetDst()->AsRegOpnd();
        Lowerer::InsertMove(ldLen->GetDst(), actualCountOpnd, ldLen);
    }
    ldLen->Remove();
    return false;
}